

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

bool __thiscall libcellml::Model::doAddComponent(Model *this,ComponentPtr *component)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  bool bVar3;
  ComponentImpl *this_00;
  shared_ptr<libcellml::Model> thisModel;
  ParentedEntity local_58;
  _func_int **local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  ParentedEntity local_38;
  
  std::__shared_ptr<libcellml::Model,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Model,void>
            ((__shared_ptr<libcellml::Model,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             (__weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libcellml::Model>);
  bVar3 = ParentedEntity::hasParent
                    ((ParentedEntity *)
                     (component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (bVar3) {
    ParentedEntity::parent(&local_58);
    pp_Var2 = local_48;
    pp_Var1 = local_58.super_Entity._vptr_Entity;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.super_Entity.mPimpl !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.super_Entity.mPimpl);
    }
    if (pp_Var2 != pp_Var1) {
      ParentedEntity::parent(&local_38);
      local_58.super_Entity._vptr_Entity = local_38.super_Entity._vptr_Entity;
      local_58.super_Entity.mPimpl = local_38.super_Entity.mPimpl;
      local_38.super_Entity._vptr_Entity = (_func_int **)0x0;
      local_38.super_Entity.mPimpl = (EntityImpl *)0x0;
      removeComponentFromEntity((EntityPtr *)&local_58,component);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.super_Entity.mPimpl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.super_Entity.mPimpl);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.super_Entity.mPimpl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.super_Entity.mPimpl);
      }
    }
  }
  this_00 = Component::pFunc((component->
                             super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
  local_58.super_Entity._vptr_Entity = local_48;
  local_58.super_Entity.mPimpl = (EntityImpl *)local_40;
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_40->_M_use_count = local_40->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_40->_M_use_count = local_40->_M_use_count + 1;
    }
  }
  ParentedEntity::ParentedEntityImpl::setParent
            ((ParentedEntityImpl *)this_00,(ParentedEntityPtr *)&local_58);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.super_Entity.mPimpl !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.super_Entity.mPimpl);
  }
  bVar3 = ComponentEntity::doAddComponent(&this->super_ComponentEntity,component);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  return bVar3;
}

Assistant:

bool Model::doAddComponent(const ComponentPtr &component)
{
    auto thisModel = shared_from_this();
    if (component->hasParent() && (thisModel != component->parent())) {
        removeComponentFromEntity(component->parent(), component);
    }
    component->pFunc()->setParent(thisModel);

    return ComponentEntity::doAddComponent(component);
}